

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

value_type *
phmap::priv::NodeHashMapPolicy<int,int>::
new_element<phmap::priv::Alloc<std::pair<int_const,int>>,std::pair<int_const,int>const&>
          (Alloc<std::pair<const_int,_int>_> *alloc,pair<const_int,_int> *args)

{
  pointer ppVar1;
  PairAlloc pair_alloc;
  
  pair_alloc.id_ = alloc->id_;
  ppVar1 = allocator_traits<phmap::priv::Alloc<std::pair<const_int,_int>_>_>::allocate
                     (&pair_alloc,1);
  *ppVar1 = *args;
  return ppVar1;
}

Assistant:

static value_type* new_element(Allocator* alloc, Args&&... args) {
        using PairAlloc = typename phmap::allocator_traits<
            Allocator>::template rebind_alloc<value_type>;
        PairAlloc pair_alloc(*alloc);
        value_type* res =
            phmap::allocator_traits<PairAlloc>::allocate(pair_alloc, 1);
        phmap::allocator_traits<PairAlloc>::construct(pair_alloc, res,
                                                      std::forward<Args>(args)...);
        return res;
    }